

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O1

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateBool
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag)

{
  bool bVar1;
  spv_result_t sVar2;
  long *plVar3;
  Instruction *inst_00;
  long *plVar4;
  uint32_t underlying_type;
  undefined1 local_6c [12];
  long local_60;
  long local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  string local_48;
  
  inst_00 = (Instruction *)local_6c;
  local_6c._0_4_ = 0;
  sVar2 = GetUnderlyingType(this->_,decoration,inst,(uint32_t *)inst_00);
  if (sVar2 == SPV_SUCCESS) {
    bVar1 = ValidationState_t::IsBoolScalarType(this->_,local_6c._0_4_);
    sVar2 = SPV_SUCCESS;
    if (!bVar1) {
      (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                ((string *)(local_6c + 0x24),decoration,(Decoration *)inst,inst_00);
      plVar3 = (long *)std::__cxx11::string::append((char *)(local_6c + 0x24));
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_58 = *plVar4;
        uStack_50 = (undefined4)plVar3[3];
        uStack_4c = *(undefined4 *)((long)plVar3 + 0x1c);
        local_6c._4_8_ = local_6c + 0x14;
      }
      else {
        local_58 = *plVar4;
        local_6c._4_8_ = (long *)*plVar3;
      }
      local_60 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((diag->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      sVar2 = (*diag->_M_invoker)((_Any_data *)diag,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_6c + 4));
      if ((undefined1 *)local_6c._4_8_ != local_6c + 0x14) {
        operator_delete((void *)local_6c._4_8_,local_58 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return sVar2;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateBool(
    const Decoration& decoration, const Instruction& inst,
    const std::function<spv_result_t(const std::string& message)>& diag) {
  uint32_t underlying_type = 0;
  if (spv_result_t error =
          GetUnderlyingType(_, decoration, inst, &underlying_type)) {
    return error;
  }

  if (!_.IsBoolScalarType(underlying_type)) {
    return diag(GetDefinitionDesc(decoration, inst) + " is not a bool scalar.");
  }

  return SPV_SUCCESS;
}